

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_writeSetting(SoapySDRDevice *device,char *key,char *value)

{
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  exception *ex;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *local_18;
  long *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,local_18,&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_20,&local_79);
  (**(code **)(*local_10 + 0x2f8))(local_10,local_40,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return 0;
}

Assistant:

int SoapySDRDevice_writeSetting(SoapySDRDevice *device, const char *key, const char *value)
{
    __SOAPY_SDR_C_TRY
    device->writeSetting(key, value);
    __SOAPY_SDR_C_CATCH
}